

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

int __thiscall phosg::BitWriter::truncate(BitWriter *this,char *__file,__off_t __length)

{
  byte bVar1;
  size_type sVar2;
  logic_error *this_00;
  size_t size_local;
  BitWriter *this_local;
  
  sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (&this->data);
  if ((char *)(sVar2 * 8 - (ulong)this->last_byte_unset_bits) < __file) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(this_00,"cannot extend a BitWriter via truncate()");
    __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (&this->data,(ulong)(__file + 7) >> 3);
  this->last_byte_unset_bits = 8 - ((byte)__file & 7) & 7;
  if (this->last_byte_unset_bits != '\0') {
    bVar1 = this->last_byte_unset_bits;
    sVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&this->data);
    this = (BitWriter *)
           ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](&this->data,sVar2 - 1);
    *(byte *)&(this->data)._M_dataplus._M_p =
         *(byte *)&(this->data)._M_dataplus._M_p & (byte)(0xff << (bVar1 & 0x1f));
  }
  return (int)this;
}

Assistant:

void BitWriter::truncate(size_t size) {
  if (size > ((this->data.size() * 8) - this->last_byte_unset_bits)) {
    throw logic_error("cannot extend a BitWriter via truncate()");
  }
  this->data.resize((size + 7) / 8);
  this->last_byte_unset_bits = (8 - (size & 7)) & 7;
  // The if statement is important here (we can't just let the & become
  // degenerate) because this->data could now be empty
  if (this->last_byte_unset_bits) {
    this->data[this->data.size() - 1] &= (0xFF << this->last_byte_unset_bits);
  }
}